

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.cpp
# Opt level: O0

void __thiscall yactfr::internal::TsdlParser::_addPseudoDtRoles(TsdlParser *this)

{
  bool bVar1;
  pointer_type pPVar2;
  PseudoDt *pPVar3;
  PseudoDsts *pPVar4;
  reference ppVar5;
  unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
  *this_00;
  pointer pPVar6;
  unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
  *pseudoDst_1;
  pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>
  *idPseudoDstPair_1;
  iterator __end2_1;
  iterator __begin2_1;
  PseudoDsts *__range2_1;
  DefClkTsRoleAdder visitor;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
  *local_e8;
  unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
  *pseudoDst;
  pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>
  *idPseudoDstPair;
  iterator __end2;
  iterator __begin2;
  PseudoDsts *__range2;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  TsdlParser *local_10;
  TsdlParser *this_local;
  
  local_10 = this;
  _setImplicitMappedClkTypeId(this);
  pPVar2 = boost::optional<yactfr::internal::PseudoTraceType>::operator->(&this->_pseudoTraceType);
  pPVar3 = PseudoTraceType::pseudoPktHeaderType(pPVar2);
  if (pPVar3 != (PseudoDt *)0x0) {
    pPVar2 = boost::optional<yactfr::internal::PseudoTraceType>::operator->(&this->_pseudoTraceType)
    ;
    pPVar3 = PseudoTraceType::pseudoPktHeaderType(pPVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,"magic",&local_31);
    _addPseudoFlUIntTypeRoles<false>(this,pPVar3,&local_30,PacketMagicNumber);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    pPVar2 = boost::optional<yactfr::internal::PseudoTraceType>::operator->(&this->_pseudoTraceType)
    ;
    pPVar3 = PseudoTraceType::pseudoPktHeaderType(pPVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"stream_id",&local_69);
    _addPseudoFlUIntTypeRoles<false>(this,pPVar3,&local_68,DataStreamTypeId);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    pPVar2 = boost::optional<yactfr::internal::PseudoTraceType>::operator->(&this->_pseudoTraceType)
    ;
    pPVar3 = PseudoTraceType::pseudoPktHeaderType(pPVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"stream_instance_id",&local_91);
    _addPseudoFlUIntTypeRoles<false>(this,pPVar3,&local_90,DataStreamId);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    pPVar2 = boost::optional<yactfr::internal::PseudoTraceType>::operator->(&this->_pseudoTraceType)
    ;
    pPVar3 = PseudoTraceType::pseudoPktHeaderType(pPVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b8,"uuid",(allocator *)((long)&__range2 + 7));
    _setPseudoSlArrayTypeMetadataStreamUuidRole(this,pPVar3,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  }
  pPVar2 = boost::optional<yactfr::internal::PseudoTraceType>::operator->(&this->_pseudoTraceType);
  pPVar4 = PseudoTraceType::pseudoDsts(pPVar2);
  __end2 = std::
           unordered_map<unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>_>_>
           ::begin(pPVar4);
  idPseudoDstPair =
       (pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>
        *)std::
          unordered_map<unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>_>_>
          ::end(pPVar4);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>,_false>
                         *)&idPseudoDstPair);
    if (!bVar1) break;
    pseudoDst = (unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
                 *)std::__detail::
                   _Node_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>,_false,_false>
                   ::operator*(&__end2);
    local_e8 = &((reference)pseudoDst)->second;
    pPVar6 = std::
             unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
             ::operator->(local_e8);
    pPVar3 = PseudoDst::pseudoPktCtxType(pPVar6);
    if (pPVar3 != (PseudoDt *)0x0) {
      pPVar6 = std::
               unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
               ::operator->(local_e8);
      pPVar3 = PseudoDst::pseudoPktCtxType(pPVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_108,"packet_size",&local_109);
      _addPseudoFlUIntTypeRoles<false>(this,pPVar3,&local_108,PacketTotalLength);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      pPVar6 = std::
               unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
               ::operator->(local_e8);
      pPVar3 = PseudoDst::pseudoPktCtxType(pPVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_130,"content_size",&local_131);
      _addPseudoFlUIntTypeRoles<false>(this,pPVar3,&local_130,PacketContentLength);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      pPVar6 = std::
               unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
               ::operator->(local_e8);
      pPVar3 = PseudoDst::pseudoPktCtxType(pPVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_158,"packet_size",&local_159);
      _addPseudoFlUIntTypeRoles<false>(this,pPVar3,&local_158,PacketTotalLength);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      pPVar6 = std::
               unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
               ::operator->(local_e8);
      pPVar3 = PseudoDst::pseudoPktCtxType(pPVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_180,"timestamp_end",&local_181);
      _addPseudoFlUIntTypeRoles<true>(this,pPVar3,&local_180,PacketEndDefaultClockTimestamp);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator((allocator<char> *)&local_181);
      pPVar6 = std::
               unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
               ::operator->(local_e8);
      pPVar3 = PseudoDst::pseudoPktCtxType(pPVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1a8,"events_discarded",&local_1a9);
      _addPseudoFlUIntTypeRoles<false>(this,pPVar3,&local_1a8,DiscardedEventRecordCounterSnapshot);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
      pPVar6 = std::
               unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
               ::operator->(local_e8);
      pPVar3 = PseudoDst::pseudoPktCtxType(pPVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1d0,"packet_seq_num",&local_1d1);
      _addPseudoFlUIntTypeRoles<false>(this,pPVar3,&local_1d0,PacketSequenceNumber);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    }
    pPVar6 = std::
             unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
             ::operator->(local_e8);
    pPVar3 = PseudoDst::pseudoErHeaderType(pPVar6);
    if (pPVar3 != (PseudoDt *)0x0) {
      pPVar6 = std::
               unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
               ::operator->(local_e8);
      pPVar3 = PseudoDst::pseudoErHeaderType(pPVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1f8,"id",
                 (allocator *)((long)&visitor.super_PseudoDtVisitor._vptr_PseudoDtVisitor + 7));
      _addPseudoFlUIntTypeRoles<false>(this,pPVar3,&local_1f8,EventRecordTypeId);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&visitor.super_PseudoDtVisitor._vptr_PseudoDtVisitor + 7)
                );
    }
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>,_false,_false>
    ::operator++(&__end2);
  }
  DefClkTsRoleAdder::DefClkTsRoleAdder((DefClkTsRoleAdder *)&__range2_1);
  pPVar2 = boost::optional<yactfr::internal::PseudoTraceType>::operator->(&this->_pseudoTraceType);
  pPVar4 = PseudoTraceType::pseudoDsts(pPVar2);
  __end2_1 = std::
             unordered_map<unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>_>_>
             ::begin(pPVar4);
  idPseudoDstPair_1 =
       (pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>
        *)std::
          unordered_map<unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>_>_>
          ::end(pPVar4);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2_1.
                        super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>,_false>
                         *)&idPseudoDstPair_1);
    if (!bVar1) break;
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>,_false,_false>
             ::operator*(&__end2_1);
    this_00 = &ppVar5->second;
    pPVar6 = std::
             unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
             ::operator->(this_00);
    pPVar3 = PseudoDst::pseudoPktCtxType(pPVar6);
    if (pPVar3 != (PseudoDt *)0x0) {
      pPVar6 = std::
               unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
               ::operator->(this_00);
      pPVar3 = PseudoDst::pseudoPktCtxType(pPVar6);
      (*pPVar3->_vptr_PseudoDt[4])(pPVar3,&__range2_1);
    }
    pPVar6 = std::
             unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
             ::operator->(this_00);
    pPVar3 = PseudoDst::pseudoErHeaderType(pPVar6);
    if (pPVar3 != (PseudoDt *)0x0) {
      pPVar6 = std::
               unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
               ::operator->(this_00);
      pPVar3 = PseudoDst::pseudoErHeaderType(pPVar6);
      (*pPVar3->_vptr_PseudoDt[4])(pPVar3,&__range2_1);
    }
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>,_false,_false>
    ::operator++(&__end2_1);
  }
  DefClkTsRoleAdder::~DefClkTsRoleAdder((DefClkTsRoleAdder *)&__range2_1);
  return;
}

Assistant:

void TsdlParser::_addPseudoDtRoles()
{
    /*
     * First, set an implicit mapped clock type internal ID on specific
     * pseudo fixed-length unsigned integer types.
     *
     * For example, if the current pseudo trace type contains a single
     * clock type, then any pseudo fixed-length unsigned integer type
     * named `timestamp` within pseudo event record header types, which
     * are not already mapped to a clock type, are mapped to this single
     * clock type.
     */
    this->_setImplicitMappedClkTypeId();

    // add/set simple roles
    if (_pseudoTraceType->pseudoPktHeaderType()) {
        this->_addPseudoFlUIntTypeRoles(*_pseudoTraceType->pseudoPktHeaderType(), "magic",
                                        UnsignedIntegerTypeRole::PacketMagicNumber);
        this->_addPseudoFlUIntTypeRoles(*_pseudoTraceType->pseudoPktHeaderType(), "stream_id",
                                        UnsignedIntegerTypeRole::DataStreamTypeId);
        this->_addPseudoFlUIntTypeRoles(*_pseudoTraceType->pseudoPktHeaderType(),
                                        "stream_instance_id",
                                        UnsignedIntegerTypeRole::DataStreamId);
        this->_setPseudoSlArrayTypeMetadataStreamUuidRole(*_pseudoTraceType->pseudoPktHeaderType(),
                                                          "uuid");
    }

    for (auto& idPseudoDstPair : _pseudoTraceType->pseudoDsts()) {
        auto& pseudoDst = idPseudoDstPair.second;

        if (pseudoDst->pseudoPktCtxType()) {
            this->_addPseudoFlUIntTypeRoles(*pseudoDst->pseudoPktCtxType(), "packet_size",
                                            UnsignedIntegerTypeRole::PacketTotalLength);
            this->_addPseudoFlUIntTypeRoles(*pseudoDst->pseudoPktCtxType(), "content_size",
                                            UnsignedIntegerTypeRole::PacketContentLength);
            this->_addPseudoFlUIntTypeRoles(*pseudoDst->pseudoPktCtxType(), "packet_size",
                                            UnsignedIntegerTypeRole::PacketTotalLength);
            this->_addPseudoFlUIntTypeRoles<true>(*pseudoDst->pseudoPktCtxType(), "timestamp_end",
                                                  UnsignedIntegerTypeRole::PacketEndDefaultClockTimestamp);
            this->_addPseudoFlUIntTypeRoles(*pseudoDst->pseudoPktCtxType(), "events_discarded",
                                            UnsignedIntegerTypeRole::DiscardedEventRecordCounterSnapshot);
            this->_addPseudoFlUIntTypeRoles(*pseudoDst->pseudoPktCtxType(), "packet_seq_num",
                                            UnsignedIntegerTypeRole::PacketSequenceNumber);
        }

        if (pseudoDst->pseudoErHeaderType()) {
            this->_addPseudoFlUIntTypeRoles(*pseudoDst->pseudoErHeaderType(), "id",
                                            UnsignedIntegerTypeRole::EventRecordTypeId);
        }
    }

    // add "default clock timestamp" role
    DefClkTsRoleAdder visitor;

    for (auto& idPseudoDstPair : _pseudoTraceType->pseudoDsts()) {
        auto& pseudoDst = idPseudoDstPair.second;

        if (pseudoDst->pseudoPktCtxType()) {
            pseudoDst->pseudoPktCtxType()->accept(visitor);
        }

        if (pseudoDst->pseudoErHeaderType()) {
            pseudoDst->pseudoErHeaderType()->accept(visitor);
        }
    }
}